

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::FlushLogFiles(int min_severity)

{
  LogDestination *pLVar1;
  LogDestination *log;
  int i;
  MutexLock l;
  int min_severity_local;
  
  l.mu_._4_4_ = min_severity;
  ::glog_internal_namespace_::MutexLock::MutexLock
            ((MutexLock *)&stack0xffffffffffffffe8,(Mutex *)log_mutex);
  for (log._4_4_ = l.mu_._4_4_; log._4_4_ < 4; log._4_4_ = log._4_4_ + 1) {
    pLVar1 = log_destination(log._4_4_);
    if (pLVar1 != (LogDestination *)0x0) {
      (*pLVar1->logger_->_vptr_Logger[3])();
    }
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(i);
    if (log != NULL) {
      log->logger_->Flush();
    }
  }
}